

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

idx_t duckdb::Interpolator<true>::Index(QuantileValue *q,idx_t n)

{
  bool bVar1;
  InvalidInputException *this;
  int64_t iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  hugeint_t hVar5;
  hugeint_t hVar6;
  unsigned_long result;
  hugeint_t scaling;
  hugeint_t scaled_n;
  hugeint_t scaled_q;
  ulong local_90;
  string local_88;
  hugeint_t local_68;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  if (q->val == (Value)0x15) {
    hVar6 = q->integral;
    local_68.lower = (q->scaling).lower;
    local_68.upper = (q->scaling).upper;
    hVar5 = Hugeint::Convert<unsigned_long>(n);
    local_38 = duckdb::DecimalMultiplyOverflowCheck::
               Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar5,hVar6);
    hVar5 = Hugeint::Convert<unsigned_long>(n);
    hVar6.upper = local_68.upper;
    hVar6.lower = local_68.lower;
    local_48 = duckdb::DecimalMultiplyOverflowCheck::
               Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(hVar5,hVar6);
    local_58 = (hugeint_t)duckdb::hugeint_t::operator-(&local_48,&local_38);
    hVar6 = (hugeint_t)duckdb::hugeint_t::operator/(&local_58,&local_68);
    hVar5.lower = hVar6.upper;
    iVar2 = 0;
    bVar1 = duckdb::TryCast::Operation<duckdb::hugeint_t,unsigned_long>(hVar6,&local_90,false);
    if (!bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      hVar5.upper = iVar2;
      CastExceptionText<duckdb::hugeint_t,unsigned_long>(&local_88,(duckdb *)hVar6.lower,hVar5);
      duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_88);
      __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    auVar4._8_4_ = (int)(n >> 0x20);
    auVar4._0_8_ = n;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0);
    dVar3 = floor(dVar3 - q->dbl * dVar3);
    local_90 = (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f | (long)dVar3;
  }
  return (n - local_90) + -1 + (ulong)(n - local_90 == 0);
}

Assistant:

static inline idx_t Index(const QuantileValue &q, const idx_t n) {
		idx_t floored;
		switch (q.val.type().id()) {
		case LogicalTypeId::DECIMAL: {
			//	Integer arithmetic for accuracy
			const auto integral = q.integral;
			const auto scaling = q.scaling;
			const auto scaled_q =
			    DecimalMultiplyOverflowCheck::Operation<hugeint_t, hugeint_t, hugeint_t>(Hugeint::Convert(n), integral);
			const auto scaled_n =
			    DecimalMultiplyOverflowCheck::Operation<hugeint_t, hugeint_t, hugeint_t>(Hugeint::Convert(n), scaling);
			floored = Cast::Operation<hugeint_t, idx_t>((scaled_n - scaled_q) / scaling);
			break;
		}
		default:
			const auto scaled_q = double(n) * q.dbl;
			floored = LossyNumericCast<idx_t>(floor(double(n) - scaled_q));
			break;
		}

		return MaxValue<idx_t>(1, n - floored) - 1;
	}